

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O0

void __thiscall EmmyFacade::~EmmyFacade(EmmyFacade *this)

{
  EmmyFacade *this_local;
  
  EmmyDebuggerManager::~EmmyDebuggerManager(&this->_emmyDebuggerManager);
  std::set<lua_State_*,_std::less<lua_State_*>,_std::allocator<lua_State_*>_>::~set
            (&this->mainStates);
  std::shared_ptr<Transporter>::~shared_ptr(&this->transporter);
  std::condition_variable::~condition_variable(&this->waitIDECV);
  std::function<void_()>::~function(&this->StartHook);
  return;
}

Assistant:

EmmyFacade::~EmmyFacade() {
}